

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

string * __thiscall
soul::AST::Connection::getDefaultEndpointName_abi_cxx11_
          (string *__return_storage_ptr__,Connection *this,Context *errorContext,ProcessorBase *p,
          bool wantInput)

{
  EndpointDeclaration *pEVar1;
  pool_ptr<soul::AST::EndpointDeclaration> pVar2;
  long *plVar3;
  EndpointDeclaration *pEVar4;
  string *psVar5;
  EndpointDeclaration *pEVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  pool_ptr<soul::AST::EndpointDeclaration> found;
  pool_ptr<soul::AST::EndpointDeclaration> local_90;
  CompileMessage local_88;
  CompileMessage local_50;
  
  local_90.object = (EndpointDeclaration *)0x0;
  auVar8 = (**(code **)((long)&(((errorContext->location).sourceCode.object)->content).field_2 + 8))
                     (errorContext);
  plVar3 = auVar8._0_8_;
  pEVar6 = (EndpointDeclaration *)0x0;
  pEVar4 = (EndpointDeclaration *)0x0;
  while( true ) {
    if (plVar3 == auVar8._8_8_) {
      if (pEVar6 == (EndpointDeclaration *)0x0) {
        if ((char)p == '\0') {
          Errors::processorHasNoSuitableOutputs<>();
        }
        else {
          Errors::processorHasNoSuitableInputs<>();
        }
        Context::throwError((Context *)this,&local_88,false);
      }
      pEVar4 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_90);
      psVar5 = Identifier::toString_abi_cxx11_(&pEVar4->name);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
      return __return_storage_ptr__;
    }
    pEVar1 = (EndpointDeclaration *)*plVar3;
    pVar2.object = local_90.object;
    if (((pEVar1->isConsoleEndpoint == false) && (pEVar1->isInput == (bool)(char)p)) &&
       (bVar7 = pEVar4 != (EndpointDeclaration *)0x0, pEVar4 = pEVar1, pEVar6 = pEVar1,
       pVar2.object = pEVar1, bVar7)) break;
    local_90.object = pVar2.object;
    plVar3 = plVar3 + 1;
  }
  Errors::mustBeOnlyOneEndpoint<>();
  Context::throwError((Context *)this,&local_50,false);
}

Assistant:

static std::string getDefaultEndpointName (const Context& errorContext, ProcessorBase& p, bool wantInput)
        {
            pool_ptr<EndpointDeclaration> found;

            for (auto& e : p.getEndpoints())
            {
                if (!e->isConsoleEndpoint && e->isInput == wantInput)
                {
                    if (found != nullptr)
                        errorContext.throwError (Errors::mustBeOnlyOneEndpoint());

                    found = e;
                }
            }

            if (found == nullptr)
                errorContext.throwError (wantInput ? Errors::processorHasNoSuitableInputs()
                                                   : Errors::processorHasNoSuitableOutputs());

            return found->name.toString();
        }